

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JobResults.cpp
# Opt level: O0

void __thiscall
xmrig::JobResultsPrivate::JobResultsPrivate
          (JobResultsPrivate *this,IJobResultListener *listener,bool hwAES)

{
  void *pvVar1;
  undefined8 uVar2;
  byte in_DL;
  undefined8 in_RSI;
  byte *in_RDI;
  
  *in_RDI = in_DL & 1;
  *(undefined8 *)(in_RDI + 8) = in_RSI;
  std::__cxx11::list<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>::list
            ((list<xmrig::JobResult,_std::allocator<xmrig::JobResult>_> *)0x232cff);
  std::mutex::mutex((mutex *)0x232d0d);
  std::__cxx11::list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_>::list
            ((list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_> *)0x232d20);
  pvVar1 = operator_new(0x80);
  *(void **)(in_RDI + 0x50) = pvVar1;
  **(undefined8 **)(in_RDI + 0x50) = in_RDI;
  uVar2 = uv_default_loop();
  uv_async_init(uVar2,*(undefined8 *)(in_RDI + 0x50),onResult);
  return;
}

Assistant:

inline JobResultsPrivate(IJobResultListener *listener, bool hwAES) :
        m_hwAES(hwAES),
        m_listener(listener)
    {
        m_async = new uv_async_t;
        m_async->data = this;

        uv_async_init(uv_default_loop(), m_async, JobResultsPrivate::onResult);
    }